

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O1

int fits_write_keys_histoe
              (fitsfile *fptr,fitsfile *histptr,int naxis,int *colnum,char (*colname) [71],
              char **colexpr,int *status)

{
  fitsfile *fptr_00;
  int *piVar1;
  char (*value) [71];
  ulong uVar2;
  char *comm;
  int iVar3;
  int tstatus;
  char keyname [75];
  char svalue [71];
  int local_114;
  undefined8 local_110;
  char (*local_108) [71];
  fitsfile *local_100;
  char (*local_f8) [71];
  ulong local_f0;
  fitsfile *local_e8;
  int *local_e0;
  char **local_d8;
  ulong local_d0;
  char local_c8 [80];
  char local_78 [72];
  
  iVar3 = *status;
  if (iVar3 < 1) {
    if (0 < naxis) {
      local_d0 = (ulong)(uint)naxis;
      uVar2 = 0;
      local_108 = colname;
      local_100 = histptr;
      local_e8 = fptr;
      local_e0 = colnum;
      local_d8 = colexpr;
      do {
        value = (char (*) [71])local_78;
        local_114 = 0;
        if ((((colexpr == (char **)0x0) || (colexpr[uVar2] == (char *)0x0)) ||
            (local_108 == (char (*) [71])0x0)) || (*colexpr[uVar2] == '\0')) {
          local_114 = 0;
          local_f0 = uVar2;
          ffkeyn("CTYPE",(int)uVar2 + 1,local_c8,&local_114);
          uVar2 = local_f0;
          ffgky(histptr,0x10,local_c8,value,(char *)0x0,&local_114);
          piVar1 = local_e0;
          if (local_114 != 0) {
            local_114 = 0;
            local_f8 = colname;
            ffkeyn("TTYPE",local_e0[uVar2],local_c8,&local_114);
            fptr_00 = local_e8;
            ffgky(local_e8,0x10,local_c8,value,(char *)0x0,&local_114);
            if (local_114 == 0) {
              ffkeyn("CTYPE",(int)uVar2 + 1,local_c8,&local_114);
              ffpky(local_100,0x10,local_c8,value,"Coordinate Type",&local_114);
            }
            local_114 = 0;
            ffkeyn("TUNIT",piVar1[uVar2],local_c8,&local_114);
            ffgky(fptr_00,0x10,local_c8,value,(char *)0x0,&local_114);
            histptr = local_100;
            if (local_114 == 0) {
              ffkeyn("CUNIT",(int)uVar2 + 1,local_c8,&local_114);
              comm = "Coordinate Units";
              uVar2 = local_f0;
              goto LAB_001c1e9d;
            }
            goto LAB_001c1ea2;
          }
        }
        else {
          ffkeyn("CTYPE",(int)uVar2 + 1,local_c8,&local_114);
          comm = "Coordinate Type";
          value = colname;
          local_f8 = colname;
LAB_001c1e9d:
          ffpky(histptr,0x10,local_c8,value,comm,&local_114);
LAB_001c1ea2:
          local_110 = 0x3ff0000000000000;
          local_114 = 0;
          iVar3 = (int)uVar2 + 1;
          ffkeyn("CRPIX",iVar3,local_c8,&local_114);
          ffpky(histptr,0x52,local_c8,&local_110,"Reference Pixel",&local_114);
          local_110 = 0x3ff0000000000000;
          local_114 = 0;
          ffkeyn("CRVAL",iVar3,local_c8,&local_114);
          ffpky(histptr,0x52,local_c8,&local_110,"Reference Value",&local_114);
          local_110 = 0x3ff0000000000000;
          local_114 = 0;
          ffkeyn("CDELT",iVar3,local_c8,&local_114);
          ffpky(histptr,0x52,local_c8,&local_110,"Pixel size",&local_114);
          colexpr = local_d8;
          colname = local_f8;
        }
        uVar2 = uVar2 + 1;
        colname = colname + 1;
      } while (local_d0 != uVar2);
    }
    iVar3 = *status;
  }
  return iVar3;
}

Assistant:

int fits_write_keys_histoe(
      fitsfile *fptr,   /* I - pointer to table to be binned              */
      fitsfile *histptr,  /* I - pointer to output histogram image HDU      */
      int naxis,        /* I - number of axes in the histogram image      */
      int *colnum,      /* I - column numbers (array length = naxis)      */
      char colname[4][FLEN_VALUE], /* I - if expression, then column name to use */
      char *colexpr[4], /* I - if expression, then column name to use */
      int *status)     
{      
   /*  Write default WCS keywords in the output histogram image header */
   /*  if the keywords do not already exist.   */

    int ii, tstatus;
    char keyname[FLEN_KEYWORD], svalue[FLEN_VALUE];
    double dvalue;
    
    if (*status > 0)
        return(*status);

    for (ii = 0; ii < naxis; ii++)
    {
       /*  CTYPEn  */
       tstatus = 0;

       if (colexpr && colexpr[ii] && colexpr[ii][0] && colname[ii]) 
       {
	 /* Column expression: we need to put the column name from the binning expression */
         ffkeyn("CTYPE", ii + 1, keyname, &tstatus);
         ffpky(histptr, TSTRING, keyname, colname[ii], "Coordinate Type", &tstatus);
       }
       else
       {
	 /* Column name */
	 tstatus = 0;
	 ffkeyn("CTYPE", ii+1, keyname, &tstatus);
	 ffgky(histptr, TSTRING, keyname, svalue, NULL, &tstatus);
	 
	 if (!tstatus) continue;  /* keyword already exists, so skip to next axis */

	 /* use column name as the axis name */
	 tstatus = 0;
	 ffkeyn("TTYPE", colnum[ii], keyname, &tstatus);
	 ffgky(fptr, TSTRING, keyname, svalue, NULL, &tstatus);
	 
	 if (!tstatus)
	   {
	     ffkeyn("CTYPE", ii + 1, keyname, &tstatus);
	     ffpky(histptr, TSTRING, keyname, svalue, "Coordinate Type", &tstatus);
	   }
	 
	 /*  CUNITn,  use the column units */
	 tstatus = 0;
	 ffkeyn("TUNIT", colnum[ii], keyname, &tstatus);
	 ffgky(fptr, TSTRING, keyname, svalue, NULL, &tstatus);
	 
	 if (!tstatus)
	   {
	     ffkeyn("CUNIT", ii + 1, keyname, &tstatus);
	     ffpky(histptr, TSTRING, keyname, svalue, "Coordinate Units", &tstatus);
	   }
       }

       /*  CRPIXn  - Reference Pixel choose first pixel in new image as ref. pix. */
       dvalue = 1.0;
       tstatus = 0;
       ffkeyn("CRPIX", ii + 1, keyname, &tstatus);
       ffpky(histptr, TDOUBLE, keyname, &dvalue, "Reference Pixel", &tstatus);

       /*  CRVALn - Value at the location of the reference pixel */
       dvalue = 1.0;
       tstatus = 0;
       ffkeyn("CRVAL", ii + 1, keyname, &tstatus);
       ffpky(histptr, TDOUBLE, keyname, &dvalue, "Reference Value", &tstatus);

       /*  CDELTn - unit size of pixels  */
       dvalue = 1.0;  
       tstatus = 0;
       dvalue = 1.;
       ffkeyn("CDELT", ii + 1, keyname, &tstatus);
       ffpky(histptr, TDOUBLE, keyname, &dvalue, "Pixel size", &tstatus);

    }
    return(*status);
}